

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableFieldSetter(CppGenerator *this,FieldDef *field)

{
  Value *type;
  CodeWriter *pCVar1;
  EnumDef *pEVar2;
  char *__s;
  string *psVar3;
  string wire_type_1;
  string accessor;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> underlying;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string wire_type;
  string offset_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  type = &field->value;
  if ((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) {
    pEVar2 = (field->value).type.enum_def;
    if ((pEVar2 != (EnumDef *)0x0) && (pEVar2->is_union != false)) {
      return;
    }
    GenFieldOffsetName_abi_cxx11_(&offset_str,this,field);
    GenTypeWire_abi_cxx11_(&wire_type,this,&type->type,"",false,field->offset64);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wire_type_1,"SET_FN",(allocator<char> *)&local_220);
    std::operator+(&underlying,"SetField<",&wire_type);
    std::operator+(&accessor,&underlying,">");
    pCVar1 = &this->code_;
    CodeWriter::SetValue(pCVar1,&wire_type_1,&accessor);
    std::__cxx11::string::~string((string *)&accessor);
    std::__cxx11::string::~string((string *)&underlying);
    std::__cxx11::string::~string((string *)&wire_type_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wire_type_1,"OFFSET_NAME",(allocator<char> *)&accessor);
    CodeWriter::SetValue(pCVar1,&wire_type_1,&offset_str);
    std::__cxx11::string::~string((string *)&wire_type_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wire_type_1,"FIELD_TYPE",(allocator<char> *)&underlying);
    GenTypeBasic_abi_cxx11_(&accessor,this,&type->type,true);
    CodeWriter::SetValue(pCVar1,&wire_type_1,&accessor);
    std::__cxx11::string::~string((string *)&accessor);
    std::__cxx11::string::~string((string *)&wire_type_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wire_type_1,"FIELD_VALUE",(allocator<char> *)&local_1e0);
    Name_abi_cxx11_(&local_220,this,field);
    std::operator+(&underlying,"_",&local_220);
    GenUnderlyingCast(&accessor,this,field,false,&underlying);
    CodeWriter::SetValue(pCVar1,&wire_type_1,&accessor);
    std::__cxx11::string::~string((string *)&accessor);
    std::__cxx11::string::~string((string *)&underlying);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&wire_type_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"  bool mutate_{{FIELD_NAME}}({{FIELD_TYPE}} _{{FIELD_NAME}}\\",
               (allocator<char> *)&wire_type_1);
    CodeWriter::operator+=(pCVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,") {",(allocator<char> *)&wire_type_1);
      CodeWriter::operator+=(pCVar1,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}});",
                 (allocator<char> *)&wire_type_1);
      CodeWriter::operator+=(pCVar1,&local_e0);
      psVar3 = &local_e0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&wire_type_1,"DEFAULT_VALUE",(allocator<char> *)&underlying);
      GenDefaultConstant_abi_cxx11_(&accessor,this,field);
      CodeWriter::SetValue(pCVar1,&wire_type_1,&accessor);
      std::__cxx11::string::~string((string *)&accessor);
      std::__cxx11::string::~string((string *)&wire_type_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&wire_type_1,"INTERFACE_DEFAULT_VALUE",(allocator<char> *)&local_220);
      GenDefaultConstant_abi_cxx11_(&underlying,this,field);
      GenUnderlyingCast(&accessor,this,field,true,&underlying);
      CodeWriter::SetValue(pCVar1,&wire_type_1,&accessor);
      std::__cxx11::string::~string((string *)&accessor);
      std::__cxx11::string::~string((string *)&underlying);
      std::__cxx11::string::~string((string *)&wire_type_1);
      if ((type->type).base_type == BASE_TYPE_BOOL) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60," = {{DEFAULT_VALUE}}) {",(allocator<char> *)&wire_type_1);
        CodeWriter::operator+=(pCVar1,&local_60);
        psVar3 = &local_60;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80," = {{INTERFACE_DEFAULT_VALUE}}) {",
                   (allocator<char> *)&wire_type_1);
        CodeWriter::operator+=(pCVar1,&local_80);
        psVar3 = &local_80;
      }
      std::__cxx11::string::~string((string *)psVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}}, {{DEFAULT_VALUE}});",
                 (allocator<char> *)&wire_type_1);
      CodeWriter::operator+=(pCVar1,&local_a0);
      psVar3 = &local_a0;
    }
    std::__cxx11::string::~string((string *)psVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"  }",(allocator<char> *)&wire_type_1);
    CodeWriter::operator+=(pCVar1,&local_100);
    psVar3 = &local_100;
  }
  else {
    GenFieldOffsetName_abi_cxx11_(&offset_str,this,field);
    NullableExtension_abi_cxx11_(&wire_type_1,this);
    std::operator+(&wire_type," *",&wire_type_1);
    std::__cxx11::string::~string((string *)&wire_type_1);
    GenTypeGet_abi_cxx11_(&wire_type_1,this,&type->type," ","",wire_type._M_dataplus._M_p,true);
    underlying._M_dataplus._M_p = (pointer)type;
    underlying._M_string_length = (size_type)field;
    __s = GenTableFieldSetter::anon_class_16_2_f7cfb4cb::operator()
                    ((anon_class_16_2_f7cfb4cb *)&underlying);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&accessor,__s,(allocator<char> *)&local_220);
    std::operator+(&local_180,&accessor,&wire_type_1);
    std::operator+(&local_1e0,&local_180,">(");
    std::operator+(&local_220,&local_1e0,&offset_str);
    std::operator+(&underlying,&local_220,")");
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"FIELD_TYPE",(allocator<char> *)&local_1e0);
    pCVar1 = &this->code_;
    CodeWriter::SetValue(pCVar1,&local_220,&wire_type_1);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"FIELD_VALUE",(allocator<char> *)&local_180);
    GenUnderlyingCast(&local_1e0,this,field,true,&underlying);
    CodeWriter::SetValue(pCVar1,&local_220,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"  {{FIELD_TYPE}}mutable_{{FIELD_NAME}}() {",
               (allocator<char> *)&local_220);
    CodeWriter::operator+=(pCVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"    return {{FIELD_VALUE}};",(allocator<char> *)&local_220);
    CodeWriter::operator+=(pCVar1,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"  }",(allocator<char> *)&local_220);
    CodeWriter::operator+=(pCVar1,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&underlying);
    std::__cxx11::string::~string((string *)&accessor);
    psVar3 = &wire_type_1;
  }
  std::__cxx11::string::~string((string *)psVar3);
  std::__cxx11::string::~string((string *)&wire_type);
  std::__cxx11::string::~string((string *)&offset_str);
  return;
}

Assistant:

void GenTableFieldSetter(const FieldDef &field) {
    const auto &type = field.value.type;
    const bool is_scalar = IsScalar(type.base_type);
    if (is_scalar && IsUnion(type))
      return;  // changing of a union's type is forbidden

    auto offset_str = GenFieldOffsetName(field);
    if (is_scalar) {
      const auto wire_type = GenTypeWire(type, "", false, field.offset64);
      code_.SetValue("SET_FN", "SetField<" + wire_type + ">");
      code_.SetValue("OFFSET_NAME", offset_str);
      code_.SetValue("FIELD_TYPE", GenTypeBasic(type, true));
      code_.SetValue("FIELD_VALUE",
                     GenUnderlyingCast(field, false, "_" + Name(field)));

      code_ += "  bool mutate_{{FIELD_NAME}}({{FIELD_TYPE}} _{{FIELD_NAME}}\\";
      if (!field.IsScalarOptional()) {
        code_.SetValue("DEFAULT_VALUE", GenDefaultConstant(field));
        code_.SetValue(
            "INTERFACE_DEFAULT_VALUE",
            GenUnderlyingCast(field, true, GenDefaultConstant(field)));

        // GenUnderlyingCast for a bool field generates 0 != 0
        // So the type has to be checked and the appropriate default chosen
        if (IsBool(field.value.type.base_type)) {
          code_ += " = {{DEFAULT_VALUE}}) {";
        } else {
          code_ += " = {{INTERFACE_DEFAULT_VALUE}}) {";
        }
        code_ +=
            "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}}, "
            "{{DEFAULT_VALUE}});";
      } else {
        code_ += ") {";
        code_ += "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}});";
      }
      code_ += "  }";
    } else {
      auto postptr = " *" + NullableExtension();
      auto wire_type = GenTypeGet(type, " ", "", postptr.c_str(), true);
      const std::string accessor = [&]() {
        if (IsStruct(type)) { return "GetStruct<"; }
        if (field.offset64) { return "GetPointer64<"; }
        return "GetPointer<";
      }();
      auto underlying = accessor + wire_type + ">(" + offset_str + ")";
      code_.SetValue("FIELD_TYPE", wire_type);
      code_.SetValue("FIELD_VALUE", GenUnderlyingCast(field, true, underlying));

      code_ += "  {{FIELD_TYPE}}mutable_{{FIELD_NAME}}() {";
      code_ += "    return {{FIELD_VALUE}};";
      code_ += "  }";
    }
  }